

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void get_payload(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                cio_read_buffer *buffer,size_t num_bytes)

{
  ulong extraout_RAX;
  
  if ((err == CIO_SUCCESS) || (get_payload_cold_1(), (extraout_RAX & 1) != 0)) {
    get_payload_cold_2();
  }
  return;
}

Assistant:

static void get_payload(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)buffered_stream;

	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	if (cio_likely(!is_control_frame(websocket->ws_private.ws_flags.opcode))) {
		size_t data_in_buffer = cio_read_buffer_unread_bytes(buffer);
		num_bytes = CIO_MIN(websocket->ws_private.remaining_read_frame_length, data_in_buffer);
		websocket->ws_private.remaining_read_frame_length -= num_bytes;
	}

	cio_read_buffer_consume(buffer, num_bytes);
	handle_frame(websocket, ptr, num_bytes);
}